

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O2

void entity_move(entity *e,void *w,vec3 *delta_pos)

{
  vec3 *pvVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  block_id block;
  int iVar5;
  vec3 *pvVar6;
  vec3 *pvVar7;
  int iVar8;
  int x;
  int y;
  int z;
  float fVar9;
  float fVar10;
  vec3 block_position;
  vec3 local_44;
  world *local_38;
  
  pvVar1 = &(e->box).max;
  pfVar2 = &(e->box).max.y;
  pfVar3 = &delta_pos->y;
  iVar8 = 0;
  local_38 = (world *)w;
  do {
    if (iVar8 == 3) {
      add_v3(&e->position,&e->position,delta_pos);
      return;
    }
    fVar9 = roundf((e->box).min.y);
    y = (int)(fVar9 + -1.0);
    while( true ) {
      fVar9 = *pfVar2;
      fVar10 = roundf(fVar9);
      if (fVar10 + 1.0 < (float)y) break;
      fVar9 = roundf((e->box).min.x);
      x = (int)(fVar9 + -1.0);
      while( true ) {
        fVar9 = roundf(pvVar1->x);
        if (fVar9 + 1.0 < (float)x) break;
        fVar9 = roundf((e->box).min.z);
        z = (int)(fVar9 + -1.0);
        while( true ) {
          fVar9 = roundf((e->box).max.z);
          if (fVar9 + 1.0 < (float)z) break;
          block = world_get_block(local_38,x,y,z);
          iVar5 = block_is_obstacle(block);
          if (iVar5 != 0) {
            local_44.x = (float)x;
            local_44.y = (float)y + -0.5;
            local_44.z = (float)z;
            bounding_box_update(&block_box,&local_44);
            if (iVar8 == 1) {
              pfVar4 = &(e->box).min.z;
              if ((((*pfVar4 <= block_box.max.z && block_box.max.z != *pfVar4) &&
                   (block_box.min.z < (e->box).max.z)) &&
                  (pfVar4 = &(e->box).min.y,
                  *pfVar4 <= block_box.max.y && block_box.max.y != *pfVar4)) &&
                 (block_box.min.y < *pfVar2)) {
                fVar9 = delta_pos->x;
                if (((0.0 < fVar9) && (pvVar1->x <= block_box.min.x)) &&
                   (fVar10 = block_box.min.x - pvVar1->x, fVar10 < fVar9)) {
                  delta_pos->x = fVar10;
                  fVar9 = fVar10;
                }
                if (((fVar9 < 0.0) && (fVar10 = (e->box).min.x, block_box.max.x <= fVar10)) &&
                   (fVar10 = block_box.max.x - fVar10, pvVar6 = delta_pos, fVar9 < fVar10)) {
LAB_001083bc:
                  pvVar6->x = fVar10;
                }
              }
            }
            else if (iVar8 == 0) {
              pfVar4 = &(e->box).min.z;
              if ((((*pfVar4 <= block_box.max.z && block_box.max.z != *pfVar4) &&
                   (block_box.min.z < (e->box).max.z)) &&
                  (pvVar6 = &(e->box).min,
                  pvVar6->x <= block_box.max.x && block_box.max.x != pvVar6->x)) &&
                 (block_box.min.x < pvVar1->x)) {
                fVar9 = *pfVar3;
                if (((0.0 < fVar9) && (*pfVar2 <= block_box.min.y)) &&
                   (fVar10 = block_box.min.y - *pfVar2, fVar10 < fVar9)) {
                  *pfVar3 = fVar10;
                  fVar9 = fVar10;
                }
                if (((fVar9 < 0.0) && (fVar10 = (e->box).min.y, block_box.max.y <= fVar10)) &&
                   (fVar10 = block_box.max.y - fVar10, pvVar6 = (vec3 *)pfVar3, fVar9 < fVar10))
                goto LAB_001083bc;
              }
            }
            else {
              pvVar6 = &(e->box).min;
              if ((((pvVar6->x <= block_box.max.x && block_box.max.x != pvVar6->x) &&
                   (block_box.min.x < pvVar1->x)) &&
                  (pfVar4 = &(e->box).min.y,
                  *pfVar4 <= block_box.max.y && block_box.max.y != *pfVar4)) &&
                 (block_box.min.y < *pfVar2)) {
                fVar9 = delta_pos->z;
                if (((0.0 < fVar9) && (fVar10 = (e->box).max.z, fVar10 <= block_box.min.z)) &&
                   (fVar10 = block_box.min.z - fVar10, fVar10 < fVar9)) {
                  delta_pos->z = fVar10;
                  fVar9 = fVar10;
                }
                if (((fVar9 < 0.0) && (fVar10 = (e->box).min.z, block_box.max.z <= fVar10)) &&
                   (fVar10 = block_box.max.z - fVar10, fVar9 < fVar10)) {
                  delta_pos->z = fVar10;
                }
              }
            }
          }
          z = z + 1;
        }
        x = x + 1;
      }
      y = y + 1;
    }
    if (iVar8 == 0) {
      (e->box).min.y = *pfVar3 + (e->box).min.y;
      pvVar6 = (vec3 *)pfVar3;
      pvVar7 = (vec3 *)pfVar2;
LAB_001084d0:
      pvVar7->x = fVar9 + pvVar6->x;
    }
    else if (iVar8 == 1) {
      (e->box).min.x = delta_pos->x + (e->box).min.x;
      fVar9 = delta_pos->x;
      pvVar6 = pvVar1;
      pvVar7 = pvVar1;
      goto LAB_001084d0;
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

void entity_move(entity *e, void *w, vec3 *delta_pos)
{
    for (int axis = 0; axis < 3; axis++)
    {
        for (int y = roundf(e->box.min.y) - 1; y <= roundf(e->box.max.y) + 1; y++)
        {
            for (int x = roundf(e->box.min.x) - 1; x <= roundf(e->box.max.x) + 1; x++)
            {
                for (int z = roundf(e->box.min.z) - 1; z <= roundf(e->box.max.z) + 1; z++)
                {
                    if (!block_is_obstacle(world_get_block(w, x, y, z)))
                        continue;

                    vec3 block_position = {x, y - 0.5f, z};
                    bounding_box_update(&block_box, &block_position);

                    if (axis == 0)
                    {
                        if (e->box.min.z < block_box.max.z && e->box.max.z > block_box.min.z && e->box.min.x < block_box.max.x && e->box.max.x > block_box.min.x)
                        {
                            if (delta_pos->y > 0.0f && e->box.max.y <= block_box.min.y)
                            {
                                float difference = block_box.min.y - e->box.max.y;
                                if (difference < delta_pos->y)
                                    delta_pos->y = difference;
                            }
                            if (delta_pos->y < 0.0f && e->box.min.y >= block_box.max.y)
                            {
                                float difference = block_box.max.y - e->box.min.y;
                                if (difference > delta_pos->y)
                                    delta_pos->y = difference;
                            }
                        }
                    }
                    else if (axis == 1)
                    {
                        if (e->box.min.z < block_box.max.z && e->box.max.z > block_box.min.z && e->box.min.y < block_box.max.y && e->box.max.y > block_box.min.y)
                        {
                            if (delta_pos->x > 0.0f && e->box.max.x <= block_box.min.x)
                            {
                                float difference = block_box.min.x - e->box.max.x;
                                if (difference < delta_pos->x)
                                    delta_pos->x = difference;
                            }
                            if (delta_pos->x < 0.0f && e->box.min.x >= block_box.max.x)
                            {
                                float difference = block_box.max.x - e->box.min.x;
                                if (difference > delta_pos->x)
                                    delta_pos->x = difference;
                            }
                        }
                    }
                    else
                    {
                        if (e->box.min.x < block_box.max.x && e->box.max.x > block_box.min.x && e->box.min.y < block_box.max.y && e->box.max.y > block_box.min.y)
                        {
                            if (delta_pos->z > 0.0f && e->box.max.z <= block_box.min.z)
                            {
                                float difference = block_box.min.z - e->box.max.z;
                                if (difference < delta_pos->z)
                                    delta_pos->z = difference;
                            }
                            if (delta_pos->z < 0.0f && e->box.min.z >= block_box.max.z)
                            {
                                float difference = block_box.max.z - e->box.min.z;
                                if (difference > delta_pos->z)
                                    delta_pos->z = difference;
                            }
                        }
                    }
                }
            }
        }
        if (axis == 0)
        {
            e->box.min.y += delta_pos->y;
            e->box.max.y += delta_pos->y;
        }
        else if (axis == 1)
        {
            e->box.min.x += delta_pos->x;
            e->box.max.x += delta_pos->x;
        }
    }

    add_v3(&e->position, &e->position, delta_pos);
}